

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lzh_decode(lzh_stream *strm,wchar_t last)

{
  lzh_dec *plVar1;
  long lVar2;
  wchar_t local_34;
  wchar_t r;
  int64_t avail_in;
  lzh_dec *ds;
  wchar_t last_local;
  lzh_stream *strm_local;
  
  plVar1 = strm->ds;
  if (plVar1->error == L'\0') {
    lVar2 = strm->avail_in;
    do {
      if (plVar1->state < L'\t') {
        local_34 = lzh_read_blocks(strm,last);
      }
      else {
        local_34 = lzh_decode_blocks(strm,last);
      }
    } while (local_34 == L'd');
    strm->total_in = (lVar2 - strm->avail_in) + strm->total_in;
    strm_local._4_4_ = local_34;
  }
  else {
    strm_local._4_4_ = plVar1->error;
  }
  return strm_local._4_4_;
}

Assistant:

static int
lzh_decode(struct lzh_stream *strm, int last)
{
	struct lzh_dec *ds = strm->ds;
	int64_t avail_in;
	int r;

	if (ds->error)
		return (ds->error);

	avail_in = strm->avail_in;
	do {
		if (ds->state < ST_GET_LITERAL)
			r = lzh_read_blocks(strm, last);
		else
			r = lzh_decode_blocks(strm, last);
	} while (r == 100);
	strm->total_in += avail_in - strm->avail_in;
	return (r);
}